

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O3

void __thiscall
capnp::_::anon_unknown_129::checkEnumList<capnp::DynamicValue::Reader>
          (anon_unknown_129 *this,Reader *reader,initializer_list<const_char_*> expected)

{
  char *__s;
  int iVar1;
  size_t __n;
  iterator ppcVar2;
  uint index;
  iterator ppcVar3;
  Reader RVar4;
  ArrayPtr<const_char> local_d0;
  ListElementCount local_bc;
  Fault f;
  undefined1 in_stack_ffffffffffffff70 [16];
  ReaderFor<capnp::DynamicList> list;
  
  ppcVar2 = expected._M_array;
  DynamicValue::Reader::AsImpl<capnp::DynamicList,_(capnp::Kind)7>::apply(&list,(Reader *)this);
  if ((iterator)(ulong)list.reader.elementCount != ppcVar2) {
    local_d0.ptr = (char *)ppcVar2;
    local_bc = list.reader.elementCount;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x14a,FAILED,"(expected.size()) == (list.size())","expected.size(), list.size()",
               (unsigned_long *)&local_d0,&local_bc);
    kj::_::Debug::Fault::fatal(&f);
  }
  if (ppcVar2 != (iterator)0x0) {
    ppcVar3 = (iterator)0x0;
    do {
      __s = *(char **)(&reader->type + (long)ppcVar3 * 2);
      index = (uint)ppcVar3;
      DynamicList::Reader::operator[]((Reader *)&f,&list,index);
      DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Reader *)&f);
      RVar4 = name((DynamicEnum)in_stack_ffffffffffffff70);
      __n = strlen(__s);
      if (RVar4.super_StringPtr.content.size_ == __n + 1) {
        iVar1 = bcmp(RVar4.super_StringPtr.content.ptr,__s,__n);
        DynamicValue::Reader::~Reader((Reader *)&f);
        if (iVar1 != 0) goto LAB_0034be2b;
      }
      else {
        DynamicValue::Reader::~Reader((Reader *)&f);
LAB_0034be2b:
        if (kj::_::Debug::minSeverity < 3) {
          DynamicList::Reader::operator[]((Reader *)&f,&list,index);
          DynamicValue::Reader::AsImpl<capnp::DynamicEnum,_(capnp::Kind)7>::apply((Reader *)&f);
          local_d0 = (ArrayPtr<const_char>)name((DynamicEnum)in_stack_ffffffffffffff70);
          kj::_::Debug::log<char_const(&)[85],char_const*const&,capnp::Text::Reader>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                     ,0x14c,ERROR,
                     "\"failed: expected \" \"(expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))\", expected.begin()[i], name(list[i].template as<DynamicEnum>())"
                     ,(char (*) [85])
                      "failed: expected (expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))"
                     ,(char **)(&reader->type + (long)ppcVar3 * 2),(Reader *)&local_d0);
          DynamicValue::Reader::~Reader((Reader *)&f);
        }
      }
      ppcVar3 = (iterator)(ulong)(index + 1);
    } while (ppcVar3 < ppcVar2);
  }
  return;
}

Assistant:

void checkEnumList(T reader, std::initializer_list<const char*> expected) {
  auto list = reader.as<DynamicList>();
  ASSERT_EQ(expected.size(), list.size());
  for (uint i = 0; i < expected.size(); i++) {
    EXPECT_EQ(expected.begin()[i], name(list[i].as<DynamicEnum>()));
  }
}